

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

int Bac_PtrMemoryNtk(Vec_Ptr_t *vNtk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  double dVar6;
  int nBytes;
  Vec_Ptr_t *vNtk_local;
  
  dVar6 = Vec_PtrMemory(vNtk);
  pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  iVar1 = Bac_PtrMemoryArray(pVVar5);
  pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  iVar2 = Bac_PtrMemoryArray(pVVar5);
  pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,3);
  iVar3 = Bac_PtrMemoryArrayArray(pVVar5);
  pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,4);
  iVar4 = Bac_PtrMemoryArrayArray(pVVar5);
  return iVar4 + iVar3 + iVar2 + iVar1 + (int)dVar6;
}

Assistant:

int Bac_PtrMemoryNtk( Vec_Ptr_t * vNtk )
{
    int nBytes = (int)Vec_PtrMemory(vNtk);
    nBytes += Bac_PtrMemoryArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1) );
    nBytes += Bac_PtrMemoryArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2) );
    nBytes += Bac_PtrMemoryArrayArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3) );
    nBytes += Bac_PtrMemoryArrayArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4) );
    return nBytes;
}